

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

programDefinition * __thiscall
glcts::TextureCubeMapArraySamplingTest::programCollectionForFunction::getProgram
          (programCollectionForFunction *this,shaderType shader_type)

{
  switch(shader_type) {
  case Compute:
    break;
  case Fragment:
    return &this->program_with_sampling_fragment_shader;
  case Geometry:
    return &this->program_with_sampling_geometry_shader;
  case Tesselation_Control:
    return &this->program_with_sampling_tesselation_control_shader;
  case Tesselation_Evaluation:
    return &this->program_with_sampling_tesselation_evaluation_shader;
  case Vertex:
    return &this->program_with_sampling_vertex_shader;
  default:
    this = (programCollectionForFunction *)0x0;
  }
  return &this->program_with_sampling_compute_shader;
}

Assistant:

const TextureCubeMapArraySamplingTest::programDefinition* TextureCubeMapArraySamplingTest::
	programCollectionForFunction::getProgram(shaderType shader_type) const
{
	switch (shader_type)
	{
	case Compute:
		return &program_with_sampling_compute_shader;
		break;
	case Fragment:
		return &program_with_sampling_fragment_shader;
		break;
	case Geometry:
		return &program_with_sampling_geometry_shader;
		break;
	case Tesselation_Control:
		return &program_with_sampling_tesselation_control_shader;
		break;
	case Tesselation_Evaluation:
		return &program_with_sampling_tesselation_evaluation_shader;
		break;
	case Vertex:
		return &program_with_sampling_vertex_shader;
		break;
	}

	return 0;
}